

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet
          (OptionInterpreter *this,const_iterator intermediate_fields_iter,
          const_iterator intermediate_fields_end,FieldDescriptor *innermost_field,
          string *debug_msg_name,UnknownFieldSet *unknown_fields)

{
  int value;
  undefined8 *puVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long *plVar7;
  LogMessage *pLVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  long lVar11;
  _Alloc_hider _Var12;
  pointer pUVar13;
  long lVar14;
  bool bVar15;
  UnknownFieldSet intermediate_unknown_fields;
  undefined1 local_a8 [64];
  const_iterator local_68;
  const_iterator local_60;
  FieldDescriptor **local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pUVar13 = (unknown_fields->fields_).
            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (uint)((ulong)((long)(unknown_fields->fields_).
                               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar13) >> 4);
  bVar15 = (int)uVar4 < 1;
  local_60._M_current = intermediate_fields_end._M_current;
  local_58 = intermediate_fields_iter._M_current;
  if (intermediate_fields_iter._M_current == intermediate_fields_end._M_current) {
    if (0 < (int)uVar4) {
      if (pUVar13->number_ != *(uint32 *)(innermost_field + 0x44)) {
        uVar6 = (ulong)(uVar4 & 0x7fffffff);
        uVar2 = 1;
        do {
          uVar10 = uVar2;
          pUVar13 = pUVar13 + 1;
          if (uVar6 == uVar10) {
            return uVar6 <= uVar10;
          }
          uVar2 = uVar10 + 1;
        } while (pUVar13->number_ != *(uint32 *)(innermost_field + 0x44));
        bVar15 = uVar6 <= uVar10;
      }
      std::operator+(&local_50,"Option \"",debug_msg_name);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_50);
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar9) {
        local_a8._16_8_ = paVar9->_M_allocated_capacity;
        local_a8._24_8_ = plVar7[3];
        local_a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_a8 + 0x10);
      }
      else {
        local_a8._16_8_ = paVar9->_M_allocated_capacity;
        local_a8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar7;
      }
      local_a8._8_8_ = plVar7[1];
      *plVar7 = (long)paVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_);
      }
      _Var12._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_002e4a45:
        operator_delete(_Var12._M_p);
      }
    }
  }
  else if (0 < (int)uVar4) {
    local_68._M_current = intermediate_fields_iter._M_current + 1;
    lVar14 = 8;
    lVar11 = 0;
    do {
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*local_58;
      if (*(int *)((long)pUVar13 + lVar14 + -8) == *(int *)(paVar9->_M_local_buf + 0x44)) {
        if (*(once_flag **)(paVar9->_M_local_buf + 0x30) != (once_flag *)0x0) {
          local_a8._0_8_ = FieldDescriptor::TypeOnceInit;
          local_50._M_dataplus._M_p = (pointer)paVar9;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(paVar9->_M_local_buf + 0x30),
                     (_func_void_FieldDescriptor_ptr **)local_a8,(FieldDescriptor **)&local_50);
        }
        value = *(int *)(paVar9->_M_local_buf + 0x38);
        if (value == 10) {
          if ((*(int *)((long)pUVar13 + lVar14 + -4) == 4) &&
             (bVar3 = ExamineIfOptionIsSet
                                (this,local_68,local_60,innermost_field,debug_msg_name,
                                 *(UnknownFieldSet **)((long)&pUVar13->number_ + lVar14)), !bVar3))
          {
            return bVar15;
          }
        }
        else {
          if (value != 0xb) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_a8,LOGLEVEL_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1a2f);
            pLVar8 = internal::LogMessage::operator<<
                               ((LogMessage *)local_a8,"Invalid wire type for CPPTYPE_MESSAGE: ");
            pLVar8 = internal::LogMessage::operator<<(pLVar8,value);
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar8);
            internal::LogMessage::~LogMessage((LogMessage *)local_a8);
            return bVar15;
          }
          if (*(int *)((long)pUVar13 + lVar14 + -4) == 3) {
            local_a8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_a8._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_a8._16_8_ = (pointer)0x0;
            puVar1 = *(undefined8 **)((long)&pUVar13->number_ + lVar14);
            bVar3 = UnknownFieldSet::ParseFromArray
                              ((UnknownFieldSet *)local_a8,(void *)*puVar1,*(int *)(puVar1 + 1));
            if ((bVar3) &&
               (bVar3 = ExamineIfOptionIsSet
                                  (this,local_68,local_60,innermost_field,debug_msg_name,
                                   (UnknownFieldSet *)local_a8), !bVar3)) {
              if (local_a8._0_8_ != local_a8._8_8_) {
                UnknownFieldSet::ClearFallback((UnknownFieldSet *)local_a8);
              }
              _Var12._M_p = (pointer)local_a8._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8._0_8_ ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                return bVar15;
              }
              goto LAB_002e4a45;
            }
            if (local_a8._0_8_ != local_a8._8_8_) {
              UnknownFieldSet::ClearFallback((UnknownFieldSet *)local_a8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete((void *)local_a8._0_8_);
            }
          }
        }
      }
      lVar11 = lVar11 + 1;
      pUVar13 = (unknown_fields->fields_).
                super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = (long)(int)((ulong)((long)(unknown_fields->fields_).
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar13)
                         >> 4);
      lVar14 = lVar14 + 0x10;
      bVar15 = lVar5 <= lVar11;
    } while (lVar11 < lVar5);
  }
  return bVar15;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(
    std::vector<const FieldDescriptor*>::const_iterator
        intermediate_fields_iter,
    std::vector<const FieldDescriptor*>::const_iterator intermediate_fields_end,
    const FieldDescriptor* innermost_field, const std::string& debug_msg_name,
    const UnknownFieldSet& unknown_fields) {
  // We do linear searches of the UnknownFieldSet and its sub-groups.  This
  // should be fine since it's unlikely that any one options structure will
  // contain more than a handful of options.

  if (intermediate_fields_iter == intermediate_fields_end) {
    // We're at the innermost submessage.
    for (int i = 0; i < unknown_fields.field_count(); i++) {
      if (unknown_fields.field(i).number() == innermost_field->number()) {
        return AddNameError("Option \"" + debug_msg_name +
                            "\" was already set.");
      }
    }
    return true;
  }

  for (int i = 0; i < unknown_fields.field_count(); i++) {
    if (unknown_fields.field(i).number() ==
        (*intermediate_fields_iter)->number()) {
      const UnknownField* unknown_field = &unknown_fields.field(i);
      FieldDescriptor::Type type = (*intermediate_fields_iter)->type();
      // Recurse into the next submessage.
      switch (type) {
        case FieldDescriptor::TYPE_MESSAGE:
          if (unknown_field->type() == UnknownField::TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet intermediate_unknown_fields;
            if (intermediate_unknown_fields.ParseFromString(
                    unknown_field->length_delimited()) &&
                !ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name,
                                      intermediate_unknown_fields)) {
              return false;  // Error already added.
            }
          }
          break;

        case FieldDescriptor::TYPE_GROUP:
          if (unknown_field->type() == UnknownField::TYPE_GROUP) {
            if (!ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end, innermost_field,
                                      debug_msg_name, unknown_field->group())) {
              return false;  // Error already added.
            }
          }
          break;

        default:
          GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: " << type;
          return false;
      }
    }
  }
  return true;
}